

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<13>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint *ptr;
  uint uVar4;
  uint uVar5;
  RepeatedField<unsigned_int> *array;
  int index;
  
  if (0 < *field) {
    index = 0;
    do {
      uVar4 = md->tag;
      pbVar2 = output->ptr;
      if (uVar4 < 0x80) {
        *pbVar2 = (byte)uVar4;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *pbVar2 = (byte)uVar4 | 0x80;
        if (uVar4 < 0x4000) {
          pbVar2[1] = (byte)(uVar4 >> 7);
          pbVar2 = pbVar2 + 2;
        }
        else {
          pbVar2 = pbVar2 + 2;
          uVar4 = uVar4 >> 7;
          do {
            pbVar3 = pbVar2;
            pbVar3[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            pbVar2 = pbVar3 + 1;
            bVar1 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar1);
          *pbVar3 = (byte)uVar5;
        }
      }
      output->ptr = pbVar2;
      ptr = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
      OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(ptr,output);
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }